

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# list.c
# Opt level: O0

int xmlListPushBack(xmlListPtr l,void *data)

{
  _xmlLink *p_Var1;
  xmlGenericErrorFunc p_Var2;
  _xmlLink *p_Var3;
  xmlGenericErrorFunc *pp_Var4;
  void **ppvVar5;
  xmlLinkPtr lkNew;
  xmlLinkPtr lkPlace;
  void *data_local;
  xmlListPtr l_local;
  
  if (l == (xmlListPtr)0x0) {
    l_local._4_4_ = 0;
  }
  else {
    p_Var1 = l->sentinel->prev;
    p_Var3 = (_xmlLink *)(*xmlMalloc)(0x18);
    if (p_Var3 == (_xmlLink *)0x0) {
      pp_Var4 = __xmlGenericError();
      p_Var2 = *pp_Var4;
      ppvVar5 = __xmlGenericErrorContext();
      (*p_Var2)(*ppvVar5,"Cannot initialize memory for new link");
      l_local._4_4_ = 0;
    }
    else {
      p_Var3->data = data;
      p_Var3->next = p_Var1->next;
      p_Var1->next->prev = p_Var3;
      p_Var1->next = p_Var3;
      p_Var3->prev = p_Var1;
      l_local._4_4_ = 1;
    }
  }
  return l_local._4_4_;
}

Assistant:

int
xmlListPushBack(xmlListPtr l, void *data)
{
    xmlLinkPtr lkPlace, lkNew;

    if (l == NULL)
        return(0);
    lkPlace = l->sentinel->prev;
    /* Add the new link */
    if (NULL ==(lkNew = (xmlLinkPtr )xmlMalloc(sizeof(xmlLink)))) {
        xmlGenericError(xmlGenericErrorContext,
		        "Cannot initialize memory for new link");
        return (0);
    }
    lkNew->data = data;
    lkNew->next = lkPlace->next;
    (lkPlace->next)->prev = lkNew;
    lkPlace->next = lkNew;
    lkNew->prev = lkPlace;
    return 1;
}